

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O0

void FOOLElimination::reportProcessed(string *inputRepr,string *outputRepr)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[PP] FOOL in:  ");
    poVar2 = std::operator<<(poVar2,(string *)in_RDI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"[PP] FOOL out: ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void FOOLElimination::reportProcessed(std::string inputRepr, std::string outputRepr) {
  if (inputRepr != outputRepr) {
    /**
     * If show_fool is set to off, the string representations of the input
     * and the output of process() may in some cases coincide, despite the
     * input and the output being different. Example: $term{$true} and
     * $true. In order to avoid misleading log messages with the input and
     * the output seeming the same, we will not log such processings at
     * all. Setting show_fool to on, however, will display everything.
     */
    std::cout << "[PP] FOOL in:  " << inputRepr  << endl;
    std::cout << "[PP] FOOL out: " << outputRepr << endl;
  }
}